

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_error_code(sqlite3_context *pCtx,int errCode)

{
  char *z;
  int local_18;
  int errCode_local;
  sqlite3_context *pCtx_local;
  
  local_18 = errCode;
  if (errCode == 0) {
    local_18 = -1;
  }
  pCtx->isError = local_18;
  if ((pCtx->pOut->flags & 1) != 0) {
    z = sqlite3ErrStr(errCode);
    setResultStrOrError(pCtx,z,-1,'\x01',(_func_void_void_ptr *)0x0);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_result_error_code(sqlite3_context *pCtx, int errCode){
  pCtx->isError = errCode ? errCode : -1;
#ifdef SQLITE_DEBUG
  if( pCtx->pVdbe ) pCtx->pVdbe->rcApp = errCode;
#endif
  if( pCtx->pOut->flags & MEM_Null ){
    setResultStrOrError(pCtx, sqlite3ErrStr(errCode), -1, SQLITE_UTF8,
                        SQLITE_STATIC);
  }
}